

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemLauncher.cpp
# Opt level: O1

bool __thiscall ApprovalTests::SystemLauncher::launch(SystemLauncher *this,string *commandLine)

{
  string launch;
  string local_30;
  
  (*(this->super_CommandLauncher)._vptr_CommandLauncher[3])(&local_30,this,commandLine);
  SystemUtils::runSystemCommandOrThrow(&local_30,this->allowNonZeroExitCodes_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool SystemLauncher::launch(const std::string& commandLine)
    {
        std::string launch = getCommandLine(commandLine);

        SystemUtils::runSystemCommandOrThrow(launch, allowNonZeroExitCodes_);
        return true;
    }